

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O1

RealType __thiscall OpenMD::CutoffGroup::getMass(CutoffGroup *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  Atom *pAVar3;
  Atom *pAVar4;
  RealType RVar5;
  
  if (this->haveTotalMass == false) {
    this->totalMass = 0.0;
    ppAVar2 = (this->cutoffAtomList).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppAVar1 = (this->cutoffAtomList).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppAVar2 == ppAVar1) {
      pAVar3 = (Atom *)0x0;
    }
    else {
      pAVar3 = *ppAVar2;
    }
    if (pAVar3 != (Atom *)0x0) {
      RVar5 = this->totalMass;
      do {
        ppAVar2 = ppAVar2 + 1;
        if (ppAVar2 == ppAVar1) {
          pAVar4 = (Atom *)0x0;
        }
        else {
          pAVar4 = *ppAVar2;
        }
        RVar5 = RVar5 + (pAVar3->super_StuntDouble).mass_;
        pAVar3 = pAVar4;
      } while (pAVar4 != (Atom *)0x0);
      this->totalMass = RVar5;
    }
    this->haveTotalMass = true;
  }
  return this->totalMass;
}

Assistant:

RealType getMass() {
      if (!haveTotalMass) {
        totalMass = 0.0;

        std::vector<Atom*>::iterator i;
        for (Atom* atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
          RealType mass = atom->getMass();
          totalMass += mass;
        }

        haveTotalMass = true;
      }

      return totalMass;
    }